

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall
embree::CommandLineParser::parseCommandLine
          (CommandLineParser *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Verbosity VVar2;
  long *plVar3;
  int iVar4;
  long lVar5;
  iterator iVar6;
  ostream *poVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  string tag0;
  string tag;
  ParseStream *local_c0;
  int local_b4;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  _Base_ptr local_90;
  CommandLineParser *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  FileName *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  *local_38;
  
  paVar1 = &local_80.field_2;
  local_38 = &this->commandLineOptionMap;
  local_90 = &(this->commandLineOptionMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88 = this;
  local_40 = path;
  do {
    Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
              (&local_60,
               &cin->ptr->
                super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
    local_b4 = std::__cxx11::string::compare((char *)&local_60);
    if (local_b4 != 0) {
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      lVar5 = std::__cxx11::string::find((char *)&local_60,0x2575cf,0);
      if (lVar5 == 0) {
        std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_60);
        std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        lVar5 = std::__cxx11::string::find((char *)&local_60,0x2575cf,0);
        if (lVar5 == 0) {
          std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_60);
          std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p);
          }
        }
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
                ::find(&local_38->_M_t,&local_60);
        if (iVar6._M_node == local_90) goto LAB_0013701e;
        plVar3 = *(long **)(iVar6._M_node + 2);
        local_c0 = cin->ptr;
        if (local_c0 != (ParseStream *)0x0) {
          (*(local_c0->
            super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_RefCount._vptr_RefCount[2])();
        }
        (**(code **)(*plVar3 + 0x20))(plVar3,&local_c0,local_40);
        if (local_c0 != (ParseStream *)0x0) {
          (*(local_c0->
            super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_RefCount._vptr_RefCount[3])();
        }
        if (iVar6._M_node == local_90) {
          VVar2 = local_88->verbosity;
          goto joined_r0x00137141;
        }
      }
      else {
LAB_0013701e:
        VVar2 = local_88->verbosity;
joined_r0x00137141:
        if (VVar2 != SILENT) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"unknown command line parameter: ",0x20);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_b0,local_a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          while( true ) {
            pbVar8 = Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::peek(&cin->ptr->
                             super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           );
            iVar4 = std::__cxx11::string::compare((char *)pbVar8);
            if ((iVar4 == 0) ||
               (pbVar8 = Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::peek(&cin->ptr->
                                 super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ), *(pbVar8->_M_dataplus)._M_p == '-')) break;
            Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::get(&local_80,
                  &cin->ptr->
                   super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 );
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_80._M_dataplus._M_p,
                                local_80._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p);
            }
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
          std::ostream::put('\x10');
          std::ostream::flush();
        }
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (local_b4 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void CommandLineParser::parseCommandLine(Ref<ParseStream> cin, const FileName& path)
  {
    while (true)
    {
      std::string tag = cin->getString();
      if (tag == "") return;
      std::string tag0 = tag;
      
      /* remove - or -- and lookup command line option */
      if (tag.find("-") == 0) 
      {
        tag = tag.substr(1);
        if (tag.find("-") == 0) tag = tag.substr(1);
        auto option = commandLineOptionMap.find(tag);
      
        /* process command line option */
        if (option != commandLineOptionMap.end()) {
          option->second->parse(cin,path);
          continue;
        }
      }
      
      if (verbosity != SILENT) {
        /* handle unknown command line options */
        std::cerr << "unknown command line parameter: " << tag0 << " ";
        while (cin->peek() != "" && cin->peek()[0] != '-') std::cerr << cin->getString() << " ";
        std::cerr << std::endl;
      }
    }
  }